

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

bool decodeOutString(DAG *_dag,
                    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *out,Unicode *_unicode)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  string temp;
  
  puVar1 = (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  uVar3 = (ulong)((int)(((long)(_dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(_dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>).
                              _M_impl.super__Vector_impl_data._M_start) / 0x28) - 1);
  temp.field_2._M_local_buf[0] = '\0';
  while (0 < (int)uVar3) {
    uVar2 = uVar3 & 0xffffffff;
    uVar3 = (ulong)(_dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar2].prev;
    Limonp::unicodeToUtf8((const_iterator)(puVar1 + uVar3),(const_iterator)(puVar1 + uVar2),&temp);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&out->c,&temp);
  }
  std::__cxx11::string::~string((string *)&temp);
  return true;
}

Assistant:

bool decodeOutString(DAG &_dag, stack<string> &out, Unicode _unicode)
{
	int i, j = _dag.size()-1;
	auto begin = _unicode.begin();
	string temp;
	while (j > 0) {
	     i = _dag[j].prev;
	     encode(begin+i, begin+j, temp);
	     j = i;
	     out.push(temp);
	}
    return true;
}